

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VocabularyTest.cpp
# Opt level: O0

void __thiscall
vocabulary_test_content_check_Test::vocabulary_test_content_check_Test
          (vocabulary_test_content_check_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__vocabulary_test_content_check_Test_0019b8e0;
  return;
}

Assistant:

TEST(vocabulary_test, content_check) {
    vector<string> words;
    unordered_set<string> source_words;
    for (int i = 0; i < 10000; i++) {
        string word;
        for (int j = 0; j < 3; j++)
            word.push_back(char('a' + prng() % 26));
        words.push_back(word);
        source_words.insert(word);
    }

    Vocabulary<string> vocab(words);
    Vocabulary<string> vocab2;
    vocab2.loads(vocab.dumps());
    unordered_set<string> target_words;
    for (string word : vocab2)
        target_words.insert(word);

    ASSERT_TRUE(source_words == target_words);
}